

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O1

int Gia_Iso2ManUniqify(Gia_Iso2Man_t *p)

{
  int iVar1;
  int *piVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  Vec_Ptr_t *pVVar5;
  Gia_Man_t *pGVar6;
  Gia_Obj_t *pGVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  void **ppvVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  size_t __nmemb;
  long lVar15;
  
  piVar2 = p->vTable->pArray;
  uVar11 = p->vTable->nSize;
  p->vPlaces->nSize = 0;
  pVVar9 = p->vTied;
  if (0 < pVVar9->nSize) {
    lVar15 = 0;
    do {
      iVar13 = pVVar9->pArray[lVar15];
      if ((long)iVar13 < 0) goto LAB_0074c61a;
      iVar1 = p->pGia->nObjs;
      if (iVar1 <= iVar13) goto LAB_0074c61a;
      pGVar3 = p->pGia->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar7 = pGVar3 + iVar13;
      uVar12 = (ulong)pGVar7->Value % (ulong)uVar11;
      while( true ) {
        iVar13 = (int)uVar12;
        uVar14 = piVar2[iVar13];
        if ((ulong)uVar14 == 0) {
          pGVar8 = (Gia_Obj_t *)0x0;
        }
        else {
          if (((int)uVar14 < 0) || (iVar1 <= (int)uVar14)) goto LAB_0074c61a;
          pGVar8 = pGVar3 + uVar14;
        }
        if (pGVar8 == (Gia_Obj_t *)0x0) {
          pGVar3 = p->pGia->pObjs;
          if ((pGVar7 < pGVar3) || (pGVar3 + p->pGia->nObjs <= pGVar7)) goto LAB_0074c639;
          piVar2[iVar13] = (int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * -0x55555555;
          Vec_IntPush(p->vPlaces,iVar13);
          goto LAB_0074c3a0;
        }
        if (pGVar8->Value == pGVar7->Value) break;
        uVar12 = (long)(iVar13 + 1) % (long)(int)uVar11 & 0xffffffff;
      }
      pGVar8->field_0x3 = pGVar8->field_0x3 | 0x40;
      pGVar7->field_0x3 = pGVar7->field_0x3 | 0x40;
LAB_0074c3a0:
      lVar15 = lVar15 + 1;
      pVVar9 = p->vTied;
    } while (lVar15 < pVVar9->nSize);
  }
  pVVar9 = p->vPlaces;
  if (0 < pVVar9->nSize) {
    piVar4 = pVVar9->pArray;
    lVar15 = 0;
    do {
      piVar2[piVar4[lVar15]] = 0;
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar9->nSize);
  }
  p->vSingles->nSize = 0;
  pVVar9 = p->vTied;
  uVar11 = pVVar9->nSize;
  uVar12 = (ulong)uVar11;
  if (0 < (int)uVar11) {
    lVar15 = 0;
    uVar14 = 0;
    do {
      uVar11 = (uint)uVar12;
      iVar13 = pVVar9->pArray[lVar15];
      if (((long)iVar13 < 0) || (p->pGia->nObjs <= iVar13)) {
LAB_0074c61a:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = p->pGia->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) goto LAB_0074c543;
      pGVar3 = pGVar3 + iVar13;
      if (((uint)*(ulong *)pGVar3 >> 0x1e & 1) == 0) {
        pVVar5 = p->vSingles;
        uVar11 = pVVar5->nCap;
        if (pVVar5->nSize == uVar11) {
          if ((int)uVar11 < 0x10) {
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc(0x80);
            }
            else {
              ppvVar10 = (void **)realloc(pVVar5->pArray,0x80);
            }
            pVVar5->pArray = ppvVar10;
            iVar13 = 0x10;
          }
          else {
            iVar13 = uVar11 * 2;
            if (iVar13 <= (int)uVar11) goto LAB_0074c515;
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc((ulong)uVar11 << 4);
            }
            else {
              ppvVar10 = (void **)realloc(pVVar5->pArray,(ulong)uVar11 << 4);
            }
            pVVar5->pArray = ppvVar10;
          }
          pVVar5->nCap = iVar13;
        }
LAB_0074c515:
        iVar13 = pVVar5->nSize;
        pVVar5->nSize = iVar13 + 1;
        pVVar5->pArray[iVar13] = pGVar3;
      }
      else {
        *(ulong *)pGVar3 = *(ulong *)pGVar3 & 0xffffffffbfffffff;
        pGVar7 = p->pGia->pObjs;
        if ((pGVar3 < pGVar7) || (pGVar7 + p->pGia->nObjs <= pGVar3)) goto LAB_0074c639;
        if (((int)uVar14 < 0) || (p->vTied->nSize <= (int)uVar14)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        uVar12 = (ulong)uVar14;
        uVar14 = uVar14 + 1;
        p->vTied->pArray[uVar12] = (int)((ulong)((long)pGVar3 - (long)pGVar7) >> 2) * -0x55555555;
      }
      lVar15 = lVar15 + 1;
      pVVar9 = p->vTied;
      uVar11 = pVVar9->nSize;
      uVar12 = (ulong)(int)uVar11;
      if ((long)uVar12 <= lVar15) goto LAB_0074c543;
    } while( true );
  }
  uVar14 = 0;
LAB_0074c543:
  if ((int)uVar11 < (int)uVar14) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  pVVar9->nSize = uVar14;
  __nmemb = (size_t)p->vSingles->nSize;
  if (1 < (long)__nmemb) {
    qsort(p->vSingles->pArray,__nmemb,8,Gia_ObjCompareByValue2);
  }
  pVVar5 = p->vSingles;
  iVar13 = pVVar5->nSize;
  if (0 < iVar13) {
    ppvVar10 = pVVar5->pArray;
    pGVar6 = p->pGia;
    pVVar9 = p->vUniques;
    pGVar3 = pGVar6->pObjs;
    lVar15 = 0;
    do {
      pGVar7 = (Gia_Obj_t *)ppvVar10[lVar15];
      uVar11 = p->nUniques;
      pGVar7->Value = pGVar7->Value + s_256Primes[uVar11 & 0xff];
      if ((pGVar7 < pGVar3) || (pGVar3 + pGVar6->nObjs <= pGVar7)) {
LAB_0074c639:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar14 = (int)((long)pGVar7 - (long)pGVar3 >> 2) * -0x55555555;
      if (((int)uVar14 < 0) || (pVVar9->nSize <= (int)uVar14)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar2 = pVVar9->pArray;
      if (piVar2[uVar14 & 0x7fffffff] != -1) {
        __assert_fail("Vec_IntEntry(p->vUniques, Gia_ObjId(p->pGia, pObj)) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso2.c"
                      ,0x150,"int Gia_Iso2ManUniqify(Gia_Iso2Man_t *)");
      }
      p->nUniques = uVar11 + 1;
      piVar2[uVar14 & 0x7fffffff] = uVar11;
      lVar15 = lVar15 + 1;
      iVar13 = pVVar5->nSize;
    } while (lVar15 < iVar13);
  }
  return iVar13;
}

Assistant:

int Gia_Iso2ManUniqify( Gia_Iso2Man_t * p )
{
    int fVerify = 0;
    Gia_Obj_t * pObj, * pTemp;
    int * pTable = Vec_IntArray(p->vTable);
    int i, k, nSize = Vec_IntSize(p->vTable);

    if ( fVerify )
        for ( k = 0; k < nSize; k++ )
            assert( pTable[k] == 0 );
    if ( fVerify )
        Gia_ManForEachObjVec( p->vTied, p->pGia, pObj, i )
            assert( pObj->fMark0 == 0 );

#if 0
    Gia_ManForEachObjVec( p->vTied, p->pGia, pObj, i )
    {
        printf( "%3d : ", Gia_ObjId(p->pGia, pObj) );
        Extra_PrintBinary( stdout, &pObj->Value, 32 );
        printf( "\n" );
    }
#endif

    // add objects to the table
    Vec_IntClear( p->vPlaces );
    Gia_ManForEachObjVec( p->vTied, p->pGia, pObj, i )
    {
        for ( k = pObj->Value % nSize; (pTemp = pTable[k] ? Gia_ManObj(p->pGia, pTable[k]) : NULL); k = (k + 1) % nSize )
            if ( pTemp->Value == pObj->Value )
            {
                pTemp->fMark0 = 1;
                pObj->fMark0 = 1;
                break;
            }
        if ( pTemp != NULL )
            continue;
        pTable[k] = Gia_ObjId(p->pGia, pObj);
        Vec_IntPush( p->vPlaces, k );
    }
    // clean the table
    Vec_IntForEachEntry( p->vPlaces, k, i )
        pTable[k] = 0;
    // collect singleton objects and compact tied objects
    k = 0;
    Vec_PtrClear( p->vSingles );
    Gia_ManForEachObjVec( p->vTied, p->pGia, pObj, i )
        if ( pObj->fMark0 == 0 )
            Vec_PtrPush( p->vSingles, pObj );
        else 
        {
            pObj->fMark0 = 0;
            Vec_IntWriteEntry( p->vTied, k++, Gia_ObjId(p->pGia, pObj) );
        }
    Vec_IntShrink( p->vTied, k );
    // sort singletons
    Vec_PtrSort( p->vSingles, (int (*)(void))Gia_ObjCompareByValue2 );
    // add them to unique and increment signature
    Vec_PtrForEachEntry( Gia_Obj_t *, p->vSingles, pObj, i )
    {
        pObj->Value += s_256Primes[p->nUniques & ISO_MASK];
        assert( Vec_IntEntry(p->vUniques, Gia_ObjId(p->pGia, pObj)) == -1 );
        Vec_IntWriteEntry( p->vUniques, Gia_ObjId(p->pGia, pObj), p->nUniques++ );
    }
    return Vec_PtrSize( p->vSingles );
}